

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O1

array<cv::RotatedRect,_10UL> *
ellipses::compute_final_ellipses_by_linear_interpolation
          (array<cv::RotatedRect,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_3UL> *ellipses,size_t ignored_index)

{
  float *pfVar1;
  long lVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  sVar3 = 0;
  memset(__return_storage_ptr__,0,200);
  pfVar1 = &ellipses->_M_elems[0].angle;
  dVar14 = 0.0;
  dVar15 = 0.0;
  dVar4 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar13 = 0.0;
  do {
    if (ignored_index != sVar3) {
      dVar16 = (double)(long)sVar3;
      dVar15 = dVar15 + (double)(long)(sVar3 * sVar3);
      dVar4 = dVar4 + (double)pfVar1[-1];
      dVar5 = dVar5 + (double)pfVar1[-1] * dVar16;
      dVar6 = dVar6 + (double)((Size2f *)(pfVar1 + -2))->width;
      dVar7 = dVar7 + (double)((Size2f *)(pfVar1 + -2))->width * dVar16;
      dVar8 = dVar8 + (double)*pfVar1;
      dVar9 = dVar9 + (double)*pfVar1 * dVar16;
      dVar17 = (double)(((RotatedRect *)(pfVar1 + -4))->center).x;
      dVar10 = dVar10 + dVar17;
      dVar11 = dVar11 + dVar17 * dVar16;
      dVar14 = dVar14 + dVar16;
      dVar12 = dVar12 + (double)pfVar1[-3];
      dVar13 = dVar13 + dVar16 * (double)pfVar1[-3];
    }
    sVar3 = sVar3 + 1;
    pfVar1 = pfVar1 + 5;
  } while (sVar3 != 3);
  dVar16 = (double)(int)(3 - (uint)(ignored_index < 3));
  dVar15 = dVar15 * dVar16 - dVar14 * dVar14;
  dVar5 = (dVar5 * dVar16 - dVar4 * dVar14) / dVar15;
  dVar7 = (dVar7 * dVar16 - dVar6 * dVar14) / dVar15;
  dVar9 = (dVar9 * dVar16 - dVar8 * dVar14) / dVar15;
  dVar11 = (dVar11 * dVar16 - dVar10 * dVar14) / dVar15;
  dVar15 = (dVar13 * dVar16 - dVar12 * dVar14) / dVar15;
  pfVar1 = &__return_storage_ptr__->_M_elems[0].angle;
  lVar2 = 0;
  do {
    dVar13 = (double)lVar2 * 0.5 + -0.5;
    (((RotatedRect *)(pfVar1 + -4))->center).x =
         (float)(dVar11 * dVar13 + (dVar10 - dVar11 * dVar14) / dVar16);
    pfVar1[-3] = (float)(dVar15 * dVar13 + (dVar12 - dVar14 * dVar15) / dVar16);
    ((Size2f *)(pfVar1 + -2))->width = (float)(dVar7 * dVar13 + (dVar6 - dVar7 * dVar14) / dVar16);
    pfVar1[-1] = (float)(dVar5 * dVar13 + (dVar4 - dVar5 * dVar14) / dVar16);
    *pfVar1 = (float)(dVar13 * dVar9 + (dVar8 - dVar9 * dVar14) / dVar16);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 5;
  } while (lVar2 != 10);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> compute_final_ellipses_by_linear_interpolation(
    const std::array<cv::RotatedRect, 3>& ellipses, std::size_t ignored_index)
{
    std::array<cv::RotatedRect, 10> result = {};

    auto sample_size = ellipses.size();
    if(ignored_index < ellipses.size())
        sample_size--;

    double x_sum, x_x_sum, height_sum, x_height_sum, width_sum, x_width_sum, angle_sum, x_angle_sum, centerx_sum,
        x_centerx_sum, centery_sum, x_centery_sum;
    x_sum = x_x_sum = height_sum = x_height_sum = width_sum = x_width_sum = angle_sum = x_angle_sum = centerx_sum
        = x_centerx_sum = centery_sum = x_centery_sum = 0;

    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(i != ignored_index)
        {
            x_sum += i;
            x_x_sum += i * i;

            height_sum += ellipses[i].size.height;
            x_height_sum += i * double(ellipses[i].size.height);

            width_sum += ellipses[i].size.width;
            x_width_sum += i * double(ellipses[i].size.width);

            angle_sum += ellipses[i].angle;
            x_angle_sum += i * double(ellipses[i].angle);

            centerx_sum += ellipses[i].center.x;
            x_centerx_sum += i * double(ellipses[i].center.x);
            centery_sum += ellipses[i].center.y;
            x_centery_sum += i * double(ellipses[i].center.y);
        }
    }

    double x_square = (sample_size * x_x_sum - x_sum * x_sum);

    double height_coef = (sample_size * x_height_sum - x_sum * height_sum) / x_square;
    double height_constant = (height_sum - height_coef * x_sum) / sample_size;

    double width_coef = (sample_size * x_width_sum - x_sum * width_sum) / x_square;
    double width_constant = (width_sum - width_coef * x_sum) / sample_size;

    double angle_coef = (sample_size * x_angle_sum - x_sum * angle_sum) / x_square;
    double angle_constant = (angle_sum - angle_coef * x_sum) / sample_size;

    double centerx_coef = (sample_size * x_centerx_sum - x_sum * centerx_sum) / x_square;
    double centerx_constant = (centerx_sum - centerx_coef * x_sum) / sample_size;
    double centery_coef = (sample_size * x_centery_sum - x_sum * centery_sum) / x_square;
    double centery_constant = (centery_sum - centery_coef * x_sum) / sample_size;

    for(std::size_t i = 0; i < result.size(); i++)
    {
        auto x = i * 0.5 - 0.5;
        cv::Point2f center(float(centerx_coef * x + centerx_constant), float(centery_coef * x + centery_constant));
        cv::Size2f size(float(width_coef * x + width_constant), float(height_coef * x + height_constant));
        float angle = float(angle_coef * x + angle_constant);
        result[i] = cv::RotatedRect(center, size, angle);
    }

    return result;
}